

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLRParser.cpp
# Opt level: O2

bool __thiscall
GLRParser::closure(GLRParser *this,
                  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>
                  *markedProductions,
                  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_>
                  *allMarkedProductions)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  _Base_ptr p_Var3;
  pointer pbVar4;
  size_t sVar5;
  _Base_ptr p_Var6;
  __type _Var7;
  bool bVar8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar9;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var10;
  reference pvVar11;
  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var12;
  _Rb_tree_node_base *p_Var13;
  string *var;
  _Rb_tree_node_base *p_Var14;
  size_t sVar15;
  pointer pbVar16;
  ulong __n;
  Production *production;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  prodTo1;
  string nextChar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  prodTo;
  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> initProductionsFromVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  prodTo2;
  set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> followingTerminalInit;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  terminalsImmRightOfMarker;
  Production *local_158;
  GLRParser *local_150;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_148;
  string local_130;
  size_t local_110;
  _Base_ptr local_108;
  _Base_ptr local_100;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  undefined1 local_d8 [48];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
  local_90;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_90._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_90._M_impl.super__Rb_tree_header._M_header;
  local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var13 = (markedProductions->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_110 = (markedProductions->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
  p_Var1 = &(markedProductions->_M_t)._M_impl.super__Rb_tree_header;
  local_100 = &(this->terminalsT)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_108 = &(this->nonTerminalsV)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_150 = this;
  local_90._M_impl.super__Rb_tree_header._M_header._M_right =
       local_90._M_impl.super__Rb_tree_header._M_header._M_left;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var13 == p_Var1) {
      p_Var3 = (markedProductions->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      std::
      __set_union<std::_Rb_tree_const_iterator<Production*>,std::_Rb_tree_const_iterator<Production*>,std::insert_iterator<std::set<Production*,std::less<Production*>,std::allocator<Production*>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (p_Var3,p_Var1,local_90._M_impl.super__Rb_tree_header._M_header._M_left,
                 &local_90._M_impl.super__Rb_tree_header,markedProductions,p_Var3);
      p_Var13 = (allMarkedProductions->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      do {
        if ((_Rb_tree_header *)p_Var13 ==
            &(allMarkedProductions->_M_t)._M_impl.super__Rb_tree_header) {
          sVar15 = (size_t)(int)local_110;
          sVar5 = (markedProductions->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
          std::
          _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
          ::~_Rb_tree(&local_90);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~_Rb_tree(&local_60);
          return sVar15 != sVar5;
        }
        local_158 = *(Production **)(p_Var13 + 1);
        pvVar9 = Production::getToP_abi_cxx11_(local_158);
        pbVar16 = (pvVar9->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pbVar4 = (pvVar9->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        while( true ) {
          if (pbVar16 == pbVar4) goto LAB_0011ad19;
          local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
          local_130._M_string_length = 0;
          local_130.field_2._M_local_buf[0] = '\0';
          p_Var1 = &local_60._M_impl.super__Rb_tree_header;
          _Var12 = std::
                   __find_if<std::_Rb_tree_const_iterator<std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                             (local_60._M_impl.super__Rb_tree_header._M_header._M_left,p_Var1,
                              pbVar16);
          if ((_Rb_tree_header *)_Var12._M_node == p_Var1) goto LAB_0011ad0f;
          getMarker_abi_cxx11_();
          _Var7 = std::operator==(pbVar16,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)local_d8);
          std::__cxx11::string::~string((string *)local_d8);
          if (_Var7) break;
          std::__cxx11::string::append((string *)&local_130);
          std::__cxx11::string::~string((string *)&local_130);
          pbVar16 = pbVar16 + 1;
        }
        pvVar9 = Production::getToP_abi_cxx11_(local_158);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_148,pvVar9);
        pbVar4 = local_148.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar16 = local_148.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        getMarker_abi_cxx11_();
        _Var10 = std::
                 __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                           (pbVar16,pbVar4,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_d8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::erase(&local_148,(const_iterator)_Var10._M_current);
        std::__cxx11::string::~string((string *)local_d8);
        var = Production::getFromP_abi_cxx11_(local_158);
        initialProductionsFromVar
                  ((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)
                   local_d8,var,allMarkedProductions);
        for (p_Var14 = (_Rb_tree_node_base *)local_d8._24_8_;
            p_Var14 != (_Rb_tree_node_base *)(local_d8 + 8);
            p_Var14 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var14)) {
          pvVar9 = Production::getToP_abi_cxx11_(*(Production **)(p_Var14 + 1));
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector(&local_a8,pvVar9);
          pbVar4 = local_a8.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          pbVar16 = local_a8.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          getMarker_abi_cxx11_();
          _Var10 = std::
                   __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                             (pbVar16,pbVar4,(string *)&local_f8);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::erase(&local_a8,(const_iterator)_Var10._M_current);
          std::__cxx11::string::~string((string *)&local_f8);
          bVar8 = std::operator==(&local_148,&local_a8);
          if (bVar8) {
            std::
            _Rb_tree<Production*,Production*,std::_Identity<Production*>,std::less<Production*>,std::allocator<Production*>>
            ::_M_insert_unique<Production*const&>
                      ((_Rb_tree<Production*,Production*,std::_Identity<Production*>,std::less<Production*>,std::allocator<Production*>>
                        *)markedProductions,&local_158);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_a8);
        }
        std::
        _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
        ::~_Rb_tree((_Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
                     *)local_d8);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_148);
LAB_0011ad0f:
        std::__cxx11::string::~string((string *)&local_130);
LAB_0011ad19:
        p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
      } while( true );
    }
    pvVar9 = Production::getToP_abi_cxx11_(*(Production **)(p_Var13 + 1));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_f8,pvVar9);
    pbVar4 = local_f8.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    pbVar16 = local_f8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    getMarker_abi_cxx11_();
    _Var10 = std::
             __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                       (pbVar16,pbVar4,(string *)local_d8);
    std::__cxx11::string::~string((string *)local_d8);
    __n = ((long)_Var10._M_current -
          (long)local_f8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start) * 0x8000000 + 0x100000000 >> 0x20;
    if (__n < (ulong)((long)local_f8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_f8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5)) {
      pvVar11 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::at(&local_f8,__n);
      std::__cxx11::string::string((string *)&local_130,(string *)pvVar11);
      p_Var6 = local_100;
      _Var12 = std::
               __find_if<std::_Rb_tree_const_iterator<std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                         ((local_150->terminalsT)._M_t._M_impl.super__Rb_tree_header._M_header.
                          _M_left,local_100,&local_130);
      p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      if (_Var12._M_node == p_Var6) {
LAB_0011aa5f:
        p_Var6 = local_108;
        _Var12 = std::
                 __find_if<std::_Rb_tree_const_iterator<std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                           ((local_150->nonTerminalsV)._M_t._M_impl.super__Rb_tree_header._M_header.
                            _M_left,local_108,&local_130);
        if (_Var12._M_node != p_Var6) {
          initialProductionsFromVar
                    ((set<Production_*,_std::less<Production_*>,_std::allocator<Production_*>_> *)
                     local_d8,&local_130,allMarkedProductions);
          std::
          __set_union<std::_Rb_tree_const_iterator<Production*>,std::_Rb_tree_const_iterator<Production*>,std::insert_iterator<std::set<Production*,std::less<Production*>,std::allocator<Production*>>>,__gnu_cxx::__ops::_Iter_less_iter>
                    (local_90._M_impl.super__Rb_tree_header._M_header._M_left,
                     &local_90._M_impl.super__Rb_tree_header,local_d8._24_8_,local_d8 + 8,&local_90,
                     local_90._M_impl.super__Rb_tree_header._M_header._M_left);
          std::
          _Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
          ::~_Rb_tree((_Rb_tree<Production_*,_Production_*,_std::_Identity<Production_*>,_std::less<Production_*>,_std::allocator<Production_*>_>
                       *)local_d8);
        }
      }
      else {
        pvVar11 = std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::at(&local_f8,__n);
        p_Var2 = &local_60._M_impl.super__Rb_tree_header;
        _Var12 = std::
                 __find_if<std::_Rb_tree_const_iterator<std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                           (p_Var3,p_Var2,pvVar11);
        if ((_Rb_tree_header *)_Var12._M_node != p_Var2) goto LAB_0011aa5f;
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string_const&>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_60,&local_130);
      }
      std::__cxx11::string::~string((string *)&local_130);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_f8);
    p_Var13 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var13);
  } while( true );
}

Assistant:

bool GLRParser::closure(std::set<Production *> &markedProductions, std::set<Production *> &allMarkedProductions) {
    std::set<std::string> terminalsImmRightOfMarker;
    std::set<Production *> followingTerminalInit;
    int originalMarkedProductionsSize = markedProductions.size();
    for (auto production: markedProductions) {
        std::vector<std::string> prodTo = production->getToP();
        auto it = std::find(prodTo.begin(), prodTo.end(), getMarker());
        // find the index
        int index = std::distance(prodTo.begin(), it);

        // Find the character to the immidiate right
        if (index + 1 < prodTo.size()) {
            // Check whether it's a terminal and whether it isn't included yet in the list
            std::string nextChar = prodTo.at(index + 1);
            if (std::find(terminalsT.begin(), terminalsT.end(), nextChar) != terminalsT.end() &&
                std::find(terminalsImmRightOfMarker.begin(), terminalsImmRightOfMarker.end(), prodTo.at(index + 1)) ==
                terminalsImmRightOfMarker.end()) {
                terminalsImmRightOfMarker.insert(nextChar);
//                changed = true;
            } else if (std::find(nonTerminalsV.begin(), nonTerminalsV.end(), nextChar) != nonTerminalsV.end()) {
                std::set<Production *> initProductionsFromVar = initialProductionsFromVar(nextChar,
                                                                                          allMarkedProductions);
//                for(auto prod: initProductionsFromVar){
//                    followingTerminalInit.insert(prod);
//                }
                set_union(followingTerminalInit.begin(), followingTerminalInit.end(), initProductionsFromVar.begin(),
                          initProductionsFromVar.end(),
                          std::inserter(followingTerminalInit, followingTerminalInit.begin()));
            }
        }
    }

    set_union(markedProductions.begin(), markedProductions.end(), followingTerminalInit.begin(),
              followingTerminalInit.end(), std::inserter(markedProductions, markedProductions.begin()));

    // "Then, we add to the set the initial forms of all rewrite rules in the grammar whose left-hand sides consist of
    // those nonterminals as well." -> What do they mean with consists of? Contains all of them? Only contains those? ...
    for (auto production: allMarkedProductions) {
        for (const auto &c: production->getToP()) {
            std::string str;
            if (std::find(terminalsImmRightOfMarker.begin(), terminalsImmRightOfMarker.end(), c) ==
                terminalsImmRightOfMarker.end()) {
                // The char is not in the list with specified terminals
                break;
            }
            if (c == getMarker()) {
                // this must only be the production of the form of the current production, not all first productions
                auto prodTo1 = production->getToP();
                prodTo1.erase(std::find(prodTo1.begin(), prodTo1.end(), getMarker()));
                std::set<Production *> init = initialProductionsFromVar(production->getFromP(), allMarkedProductions);
                for (auto prod: init) {
                    auto prodTo2 = prod->getToP();
                    prodTo2.erase(std::find(prodTo2.begin(), prodTo2.end(), getMarker()));
                    if (prodTo1 == prodTo2) { // TODO: check if still working (changed from if true)
                        markedProductions.insert(production);
//                        changed = true;
                    }
                }
                break;
            }
            str += c;
        }
    }

    // return whether anything has been changed

    return originalMarkedProductionsSize != markedProductions.size();
}